

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int checkForBiomesAtLayer
              (LayerStack *g,Layer *entry,int *cache,uint64_t seed,int x,int z,uint w,uint h,
              BiomeFilter *filter)

{
  uint64_t uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *cache_00;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  bool bVar25;
  filter_data_t fd [9];
  BiomeFilter *local_c8;
  mapfunc_t *local_c0;
  BiomeFilter *local_b8;
  mapfunc_t *local_b0;
  BiomeFilter *local_a8;
  mapfunc_t *local_a0;
  BiomeFilter *local_98;
  mapfunc_t *local_90;
  BiomeFilter *local_88;
  mapfunc_t *local_80;
  BiomeFilter *local_78;
  mapfunc_t *local_70;
  BiomeFilter *local_68;
  mapfunc_t *local_60;
  BiomeFilter *local_58;
  mapfunc_t *local_50;
  BiomeFilter *local_48;
  mapfunc_t *local_40;
  
  if ((filter->flags & 1) != 0) {
    iVar5 = entry->scale;
    iVar14 = iVar5 * x;
    iVar18 = iVar5 * z;
    iVar3 = filter->specialCnt;
    iVar21 = z >> 0x1f;
    if (0 < iVar3) {
      iVar15 = g->layers[0xe].scale;
      iVar4 = (int)(iVar18 + iVar5 * h) / iVar15;
      iVar20 = -((int)~(h + z) >> 0x1f);
      if (iVar4 + iVar20 < iVar18 / iVar15 + iVar21) {
        return 0;
      }
      uVar1 = g->layers[0xe].layerSalt;
      lVar9 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9;
      iVar24 = (int)(iVar5 * w + iVar14) / iVar15 - ((int)~(x + w) >> 0x1f);
      iVar11 = (x >> 0x1f) + iVar14 / iVar15;
      lVar19 = (long)(iVar18 / iVar15) + (long)iVar21;
      do {
        lVar17 = (long)iVar11;
        lVar23 = lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + (long)iVar11 * 0x5851f42d4c957f2d
        ;
        iVar15 = (iVar24 - iVar11) + 1;
        if (iVar11 <= iVar24) {
          do {
            lVar22 = (lVar9 + lVar17) * lVar23 + lVar19;
            lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar17;
            iVar3 = iVar3 - (uint)(((lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 +
                                    lVar19 >> 0x18) * 0x4ec4ec4ec4ec4ec5 + 0x9d89d89d89d89d8U <
                                  0x13b13b13b13b13b1);
            iVar15 = iVar15 + -1;
            lVar17 = lVar17 + 1;
            lVar23 = lVar23 + 0x5851f42d4c957f2d;
          } while (iVar15 != 0);
        }
        lVar19 = lVar19 + 1;
      } while (iVar4 + iVar20 + 1 != (int)lVar19);
      if (0 < iVar3) {
        return 0;
      }
    }
    iVar3 = g->layers[0x15].scale;
    iVar15 = (x >> 0x1f) + iVar14 / iVar3;
    iVar21 = iVar21 + iVar18 / iVar3;
    iVar14 = (int)(iVar5 * w + iVar14) / iVar3 - ((int)~(w + x) >> 0x1f);
    iVar3 = (int)(iVar5 * h + iVar18) / iVar3;
    iVar5 = -((int)~(z + h) >> 0x1f);
    if (((uint)filter->majorToFind >> 0xe & 1) != 0) {
      if (iVar3 + iVar5 < iVar21) {
        return 0;
      }
      uVar1 = g->layers[0x13].layerSalt;
      lVar9 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9;
      lVar19 = (long)iVar21;
      do {
        lVar17 = (long)iVar15;
        lVar23 = lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + (long)iVar15 * 0x5851f42d4c957f2d
        ;
        iVar18 = (iVar14 - iVar15) + 1;
        if (iVar15 <= iVar14) {
          do {
            lVar22 = (lVar9 + lVar17) * lVar23 + lVar19;
            lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar17;
            lVar22 = ((lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar19 >> 0x18)
                     * -0x70a3d70a3d70a3d7;
            if ((lVar22 + 0x51eb851eb851eb8U >> 2 | lVar22 << 0x3e) < 0x28f5c28f5c28f5d)
            goto LAB_00112a37;
            lVar17 = lVar17 + 1;
            lVar23 = lVar23 + 0x5851f42d4c957f2d;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        lVar19 = lVar19 + 1;
        if (iVar3 + iVar5 + 1 == (int)lVar19) {
          return 0;
        }
      } while( true );
    }
LAB_00112a37:
    uVar7 = 0xffffffffffffffff;
    if (iVar21 <= iVar3 + iVar5) {
      uVar1 = g->layers[0x15].layerSalt;
      lVar9 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + uVar1;
      lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9;
      lVar19 = (long)iVar21;
      uVar7 = 0;
      do {
        lVar17 = (long)iVar15;
        lVar23 = (long)iVar15 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar9 * 0x5851f42d4c957f2d
        ;
        iVar18 = (iVar14 - iVar15) + 1;
        if (iVar15 <= iVar14) {
          do {
            lVar22 = (lVar9 + lVar17) * lVar23 + lVar19;
            lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar17;
            lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar19 >> 0x18;
            lVar13 = lVar22 % 6;
            lVar22 = lVar22 % 3;
            uVar7 = ((ulong)(((uint)(lVar22 >> 0x3f) & 3) + (int)lVar22 != 0) << 0x26) +
                    0x4000000000 | uVar7;
            switch(((uint)(lVar13 >> 0x3f) & 6) + (int)lVar13) {
            case 0:
              uVar7 = uVar7 | 0x14;
              break;
            case 1:
              uVar7 = uVar7 | 0x20000004;
              break;
            case 2:
              uVar7 = uVar7 | 0xc;
              break;
            case 3:
              uVar10 = 0x800000002;
              goto LAB_00112c0a;
            case 4:
              uVar10 = 0x808000000;
LAB_00112c0a:
              uVar7 = uVar7 | uVar10;
              break;
            case 5:
              uVar7 = uVar7 | 0x42;
            }
            iVar18 = iVar18 + -1;
            lVar17 = lVar17 + 1;
            lVar23 = lVar23 + 0x5851f42d4c957f2d;
          } while (iVar18 != 0);
        }
        lVar19 = lVar19 + 1;
      } while (iVar3 + iVar5 + 1 != (int)lVar19);
      uVar7 = ~uVar7;
    }
    if ((filter->majorToFind & 0xc82800005e & uVar7) != 0) {
      return 0;
    }
  }
  iVar5 = 0;
  cache_00 = cache;
  if (cache == (int *)0x0) {
    sVar6 = getMinLayerCacheSize(entry,w,h);
    iVar5 = (int)sVar6;
    cache_00 = (int *)calloc((long)iVar5,4);
  }
  uVar8 = h * w;
  if ((1 < uVar8) && (filter->biomeToExclM != 0 || filter->biomeToExcl != 0)) {
    if (iVar5 == 0) {
      sVar6 = getMinLayerCacheSize(entry,w,h);
      iVar5 = (int)sVar6;
    }
    sVar6 = getMinLayerCacheSize(entry,1,1);
    iVar3 = 0;
    if ((int)sVar6 * 2 < iVar5) {
      setLayerSeed(entry,seed);
      iVar3 = testExclusion(entry,cache_00,(w >> 1) + x,(h >> 1) + z,filter);
    }
    if ((int)sVar6 * 5 < iVar5) {
      bVar25 = iVar3 == 0;
      iVar3 = 1;
      if (bVar25) {
        iVar3 = testExclusion(entry,cache_00,x,z,filter);
      }
      if (iVar3 == 0) {
        iVar3 = testExclusion(entry,cache_00,w + x + -1,(h - 1) + z,filter);
      }
      if (iVar3 == 0) {
        iVar3 = testExclusion(entry,cache_00,x,z + h + -1,filter);
      }
      if (iVar3 == 0) {
        iVar3 = testExclusion(entry,cache_00,w + x + -1,z,filter);
      }
    }
    if (iVar3 != 0) {
      uVar12 = 0;
      goto LAB_00113131;
    }
  }
  local_c8 = filter;
  local_c0 = g->layers[0x37].getMap;
  g->layers[0x37].data = &local_c8;
  g->layers[0x37].getMap = mapFilterOceanMix;
  local_b8 = filter;
  local_b0 = g->layers[0x2f].getMap;
  g->layers[0x2f].data = &local_b8;
  g->layers[0x2f].getMap = mapFilterRiverMix;
  local_a8 = filter;
  local_a0 = g->layers[0x22].getMap;
  g->layers[0x22].data = &local_a8;
  g->layers[0x22].getMap = mapFilterShore;
  local_98 = filter;
  local_90 = g->layers[0x1e].getMap;
  g->layers[0x1e].data = &local_98;
  g->layers[0x1e].getMap = mapFilterRareBiome;
  local_88 = filter;
  local_80 = g->layers[0x19].getMap;
  g->layers[0x19].data = &local_88;
  g->layers[0x19].getMap = mapFilterBiomeEdge;
  local_78 = filter;
  local_70 = g->layers[0x30].getMap;
  g->layers[0x30].data = &local_78;
  g->layers[0x30].getMap = mapFilterOceanTemp;
  local_68 = filter;
  local_60 = g->layers[0x15].getMap;
  g->layers[0x15].data = &local_68;
  g->layers[0x15].getMap = mapFilterBiome;
  local_58 = filter;
  local_50 = g->layers[0x13].getMap;
  g->layers[0x13].data = &local_58;
  g->layers[0x13].getMap = mapFilterMushroom;
  local_48 = filter;
  local_40 = g->layers[0xe].getMap;
  g->layers[0xe].data = &local_48;
  g->layers[0xe].getMap = mapFilterSpecial;
  setLayerSeed(entry,seed);
  iVar5 = (*entry->getMap)(entry,cache_00,x,z,w,h);
  if (iVar5 == 2) {
    uVar12 = 2;
  }
  else {
    uVar12 = 0;
    if (iVar5 == 0) {
      if (uVar8 == 0) {
        uVar7 = 0;
        uVar10 = 0;
      }
      else {
        uVar16 = 0;
        uVar10 = 0;
        uVar7 = 0;
        do {
          iVar5 = cache_00[uVar16];
          if ((long)iVar5 < 0x80) {
            uVar7 = uVar7 | 1L << ((long)iVar5 & 0x3fU);
          }
          else {
            uVar10 = uVar10 | 1L << ((ulong)(byte)((char)iVar5 + 0x80) & 0x3f);
          }
          uVar16 = uVar16 + 1;
        } while (uVar8 != uVar16);
      }
      uVar16 = filter->biomeToFind;
      uVar2 = filter->biomeToFindM;
      uVar12 = (uint)(((((filter->biomeToPickM & uVar10) != 0 || (filter->biomeToPick & uVar7) != 0)
                       || filter->biomeToPickM == 0 && filter->biomeToPick == 0) &&
                      ((filter->biomeToExclM & uVar10) == 0 && (filter->biomeToExcl & uVar7) == 0 ||
                      filter->biomeToExclM == 0 && filter->biomeToExcl == 0)) &&
                     ((uVar10 & uVar2) == uVar2 && (uVar7 & uVar16) == uVar16 ||
                     uVar2 == 0 && uVar16 == 0));
    }
  }
  g->layers[0xe].getMap = local_40;
  g->layers[0xe].data = (void *)0x0;
  g->layers[0x13].getMap = local_50;
  g->layers[0x13].data = (void *)0x0;
  g->layers[0x15].getMap = local_60;
  g->layers[0x15].data = (void *)0x0;
  g->layers[0x30].getMap = local_70;
  g->layers[0x30].data = (void *)0x0;
  g->layers[0x19].getMap = local_80;
  g->layers[0x19].data = (void *)0x0;
  g->layers[0x1e].getMap = local_90;
  g->layers[0x1e].data = (void *)0x0;
  g->layers[0x22].getMap = local_a0;
  g->layers[0x22].data = (void *)0x0;
  g->layers[0x2f].getMap = local_b0;
  g->layers[0x2f].data = (void *)0x0;
  g->layers[0x37].getMap = local_c0;
  g->layers[0x37].data = (void *)0x0;
LAB_00113131:
  if (cache == (int *)0x0) {
    free(cache_00);
  }
  return uVar12;
}

Assistant:

int checkForBiomesAtLayer(
        LayerStack        * g,
        Layer             * entry,
        int               * cache,
        uint64_t            seed,
        int                 x,
        int                 z,
        unsigned int        w,
        unsigned int        h,
        const BiomeFilter * filter
        )
{
    Layer *l;
    int *ids;
    int ret, err;
    int memsiz, mem1x1;

    if (filter->flags & BF_APPROX) // TODO: protoCheck for 1.6-
    {
        l = entry;

        int i, j;
        int bx = x * l->scale;
        int bz = z * l->scale;
        int bw = w * l->scale;
        int bh = h * l->scale;
        int x0, z0, x1, z1;
        uint64_t ss, cs;
        uint64_t potential, required;

        int specialcnt = filter->specialCnt;
        if (specialcnt > 0)
        {
            l = &g->layers[L_SPECIAL_1024];
            x0 = (bx) / l->scale; if (x < 0) x0--;
            z0 = (bz) / l->scale; if (z < 0) z0--;
            x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
            z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;
            ss = getStartSeed(seed, l->layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 13))
                        specialcnt--;
                }
            }
            if (specialcnt > 0)
                return 0;
        }

        l = &g->layers[L_BIOME_256];
        x0 = bx / l->scale; if (x < 0) x0--;
        z0 = bz / l->scale; if (z < 0) z0--;
        x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
        z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;

        if (filter->majorToFind & (1ULL << mushroom_fields))
        {
            ss = getStartSeed(seed, g->layers[L_MUSHROOM_256].layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 100))
                        goto L_has_proto_mushroom;
                }
            }
            return 0;
        }
L_has_proto_mushroom:

        potential = 0;
        required = filter->majorToFind & (
                (1ULL << badlands_plateau) | (1ULL << wooded_badlands_plateau) |
                (1ULL << desert) | (1ULL << savanna) | (1ULL << plains) |
                (1ULL << forest) | (1ULL << dark_forest) | (1ULL << mountains) |
                (1ULL << birch_forest) | (1ULL << swamp));

        ss = getStartSeed(seed, l->layerSalt);

        for (j = z0; j <= z1; j++)
        {
            for (i = x0; i <= x1; i++)
            {
                cs = getChunkSeed(ss, i, j);
                int cs6 = mcFirstInt(cs, 6);
                int cs3 = mcFirstInt(cs, 3);
                int cs4 = mcFirstInt(cs, 4);

                if (cs3) potential |= (1ULL << badlands_plateau);
                else potential |= (1ULL << wooded_badlands_plateau);

                switch (cs6)
                {
                case 0: potential |= (1ULL << desert) | (1ULL << forest); break;
                case 1: potential |= (1ULL << desert) | (1ULL << dark_forest); break;
                case 2: potential |= (1ULL << desert) | (1ULL << mountains); break;
                case 3: potential |= (1ULL << savanna) | (1ULL << plains); break;
                case 4: potential |= (1ULL << savanna) | (1ULL << birch_forest); break;
                case 5: potential |= (1ULL << plains) | (1ULL << swamp); break;
                }

                if (cs4 == 3) potential |= (1ULL << snowy_taiga);
                else potential |= (1ULL << snowy_tundra);
            }
        }

        if ((potential & required) ^ required)
            return 0;
    }

    l = g->layers;
    if (cache)
    {
        memsiz = 0;
        ids = cache;
    }
    else
    {
        memsiz = getMinLayerCacheSize(entry, w, h);
        ids = (int*) calloc(memsiz, sizeof(int));
    }

    if ((filter->biomeToExcl | filter->biomeToExclM) && w*h > 1)
    {
        err = 0;
        if (memsiz == 0)
            memsiz = getMinLayerCacheSize(entry, w, h);
        mem1x1 = getMinLayerCacheSize(entry, 1, 1);
        if (mem1x1 * 2 < memsiz)
        {
            setLayerSeed(entry, seed);
            err = testExclusion(entry, ids, x+w/2, z+h/2, filter);
        }
        if (mem1x1 * 5 < memsiz)
        {
            if (!err) err = testExclusion(entry, ids, x,     z,     filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x,     z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z,     filter);
        }
        if (err)
        {
            if (cache == NULL)
                free(ids);
            return 0;
        }
    }

    filter_data_t fd[9];
    swapMap(fd+0, filter, l+L_OCEAN_MIX_4,    mapFilterOceanMix);
    swapMap(fd+1, filter, l+L_RIVER_MIX_4,    mapFilterRiverMix);
    swapMap(fd+2, filter, l+L_SHORE_16,       mapFilterShore);
    swapMap(fd+3, filter, l+L_SUNFLOWER_64,   mapFilterRareBiome);
    swapMap(fd+4, filter, l+L_BIOME_EDGE_64,  mapFilterBiomeEdge);
    swapMap(fd+5, filter, l+L_OCEAN_TEMP_256, mapFilterOceanTemp);
    swapMap(fd+6, filter, l+L_BIOME_256,      mapFilterBiome);
    swapMap(fd+7, filter, l+L_MUSHROOM_256,   mapFilterMushroom);
    swapMap(fd+8, filter, l+L_SPECIAL_1024,   mapFilterSpecial);

    ret = 0;
    setLayerSeed(entry, seed);
    err = entry->getMap(entry, ids, x, z, w, h);
    if (err == 0)
    {
        uint64_t b = 0, m = 0;
        unsigned int i;
        for (i = 0; i < w*h; i++)
        {
            int id = ids[i];
            if (id < 128) b |= (1ULL << id);
            else m |= (1ULL << (id-128));
        }

        int match_exc = (filter->biomeToExcl|filter->biomeToExclM) == 0;
        int match_any = (filter->biomeToPick|filter->biomeToPickM) == 0;
        int match_req = (filter->biomeToFind|filter->biomeToFindM) == 0;
        match_exc |= ((b & filter->biomeToExcl) || (m & filter->biomeToExclM)) == 0;
        match_any |= ((b & filter->biomeToPick) || (m & filter->biomeToPickM));
        match_req |= ((b & filter->biomeToFind)  == filter->biomeToFind &&
                      (m & filter->biomeToFindM) == filter->biomeToFindM);
        if (match_exc && match_any && match_req)
            ret = 1;
    }
    else if (err == M_STOP)
    {   // biome requirements not met
        ret = 0;
    }
    else if (err == M_DONE)
    {   // exclusion biomes cannot generate
        ret = 2;
    }

    restoreMap(fd+8, l+L_SPECIAL_1024);
    restoreMap(fd+7, l+L_MUSHROOM_256);
    restoreMap(fd+6, l+L_BIOME_256);
    restoreMap(fd+5, l+L_OCEAN_TEMP_256);
    restoreMap(fd+4, l+L_BIOME_EDGE_64);
    restoreMap(fd+3, l+L_SUNFLOWER_64);
    restoreMap(fd+2, l+L_SHORE_16);
    restoreMap(fd+1, l+L_RIVER_MIX_4);
    restoreMap(fd+0, l+L_OCEAN_MIX_4);

    if (cache == NULL)
        free(ids);

    return ret;
}